

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

bool __thiscall Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsBool(X3DImporter *this,int pAttrIdx)

{
  FIReader *pFVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  runtime_error *prVar4;
  long *plVar5;
  long *plVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar7;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_88,pFVar1,pAttrIdx);
  if (local_88._M_dataplus._M_p == (pointer)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(local_88._M_dataplus._M_p,&FIValue::typeinfo,&FIBoolValue::typeinfo,0);
  }
  if (lVar3 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar3 = 0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_88._M_string_length + 8) =
             *(_Atomic_word *)(local_88._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_88._M_string_length + 8) =
             *(_Atomic_word *)(local_88._M_string_length + 8) + 1;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
  }
  if (lVar3 == 0) {
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar2 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar1,pAttrIdx);
    std::__cxx11::string::string
              ((string *)&local_88,(char *)CONCAT44(extraout_var,iVar2),(allocator *)&local_68);
    iVar2 = std::__cxx11::string::compare((char *)&local_88);
    bVar7 = iVar2 != 0;
    if (bVar7) {
      iVar2 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar2 != 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"Bool attribute value can contain \"false\" or \"true\" not the \""
                       ,&local_88);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_68 = (long *)*plVar5;
        plVar6 = plVar5 + 2;
        if (local_68 == plVar6) {
          local_58 = *plVar6;
          lStack_50 = plVar5[3];
          local_68 = &local_58;
        }
        else {
          local_58 = *plVar6;
        }
        local_60 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::runtime_error::runtime_error(prVar4,(string *)&local_68);
        *(undefined ***)prVar4 = &PTR__runtime_error_00900168;
        __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  else {
    if ((ulong)*(uint *)(lVar3 + 0x20) + (*(long *)(lVar3 + 0x18) - (long)*(byte **)(lVar3 + 8)) * 8
        != 1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Invalid bool value","");
      std::runtime_error::runtime_error(prVar4,(string *)&local_88);
      *(undefined ***)prVar4 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar7 = (bool)(**(byte **)(lVar3 + 8) & 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar7;
}

Assistant:

bool X3DImporter::XML_ReadNode_GetAttrVal_AsBool(const int pAttrIdx)
{
    auto boolValue = std::dynamic_pointer_cast<const FIBoolValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (boolValue) {
        if (boolValue->value.size() == 1) {
            return boolValue->value.front();
        }
        throw DeadlyImportError("Invalid bool value");
    }
    else {
        std::string val(mReader->getAttributeValue(pAttrIdx));

        if(val == "false")
            return false;
        else if(val == "true")
            return true;
        else
            throw DeadlyImportError("Bool attribute value can contain \"false\" or \"true\" not the \"" + val + "\"");
    }
}